

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_lifetime_analyzer.cpp
# Opt level: O1

void duckdb::ColumnLifetimeAnalyzer::ExtractColumnBindings
               (Expression *expr,vector<duckdb::ColumnBinding,_true> *bindings)

{
  pointer *ppCVar1;
  iterator __position;
  idx_t iVar2;
  BoundColumnRefExpression *pBVar3;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if ((expr->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pBVar3 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(&expr->super_BaseExpression);
    __position._M_current =
         (bindings->super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
         super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (bindings->super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
      _M_realloc_insert<duckdb::ColumnBinding_const&>
                ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)bindings,
                 __position,&pBVar3->binding);
    }
    else {
      iVar2 = (pBVar3->binding).column_index;
      (__position._M_current)->table_index = (pBVar3->binding).table_index;
      (__position._M_current)->column_index = iVar2;
      ppCVar1 = &(bindings->
                 super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
                 super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
  }
  local_38._8_8_ = 0;
  pcStack_20 = ::std::
               _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/column_lifetime_analyzer.cpp:55:46)>
               ::_M_invoke;
  local_28 = ::std::
             _Function_handler<void_(duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/column_lifetime_analyzer.cpp:55:46)>
             ::_M_manager;
  local_38._M_unused._M_object = bindings;
  ExpressionIterator::EnumerateChildren(expr,(function<void_(duckdb::Expression_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void ColumnLifetimeAnalyzer::ExtractColumnBindings(Expression &expr, vector<ColumnBinding> &bindings) {
	if (expr.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		auto &bound_ref = expr.Cast<BoundColumnRefExpression>();
		bindings.push_back(bound_ref.binding);
	}
	ExpressionIterator::EnumerateChildren(expr, [&](Expression &child) { ExtractColumnBindings(child, bindings); });
}